

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain_typed_unittest.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_VerifyCertificateChainSingleRootTest_::
KeyUsage<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::TestBody
          (KeyUsage<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *this)

{
  KeyUsage<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *this_local;
  
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"intermediate-lacks-signing-key-usage/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-has-keycertsign-but-not-ca/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/rsa-decipherOnly.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/rsa-digitalSignature.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/rsa-keyAgreement.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/rsa-keyEncipherment.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/ec-decipherOnly.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/ec-digitalSignature.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/ec-keyAgreement.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"target-serverauth-various-keyusages/ec-keyEncipherment.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"root-lacks-keycertsign-key-usage/main.test");
  VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate>::RunTest
            ((VerifyCertificateChainTest<bssl::(anonymous_namespace)::PathBuilderTestDelegate> *)
             this,"root-lacks-keycertsign-key-usage/ta-with-constraints.test");
  return;
}

Assistant:

TYPED_TEST_P(VerifyCertificateChainSingleRootTest, KeyUsage) {
  this->RunTest("intermediate-lacks-signing-key-usage/main.test");
  this->RunTest("target-has-keycertsign-but-not-ca/main.test");

  this->RunTest("target-serverauth-various-keyusages/rsa-decipherOnly.test");
  this->RunTest(
      "target-serverauth-various-keyusages/rsa-digitalSignature.test");
  this->RunTest("target-serverauth-various-keyusages/rsa-keyAgreement.test");
  this->RunTest("target-serverauth-various-keyusages/rsa-keyEncipherment.test");

  this->RunTest("target-serverauth-various-keyusages/ec-decipherOnly.test");
  this->RunTest("target-serverauth-various-keyusages/ec-digitalSignature.test");
  this->RunTest("target-serverauth-various-keyusages/ec-keyAgreement.test");
  this->RunTest("target-serverauth-various-keyusages/ec-keyEncipherment.test");

  this->RunTest("root-lacks-keycertsign-key-usage/main.test");
  this->RunTest("root-lacks-keycertsign-key-usage/ta-with-constraints.test");
}